

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

Image16Bit * Image_Function::ConvertTo16Bit(Image16Bit *__return_storage_ptr__,Image *in)

{
  ImageTemplate<unsigned_short> IStack_48;
  
  PenguinV_Image::ImageTemplate<unsigned_short>::ImageTemplate(&IStack_48,0,0,'\x01','\x01');
  PenguinV_Image::ImageTemplate<unsigned_short>::generate
            (__return_storage_ptr__,&IStack_48,in->_width,in->_height,in->_colorCount,'\x01');
  PenguinV_Image::ImageTemplate<unsigned_short>::~ImageTemplate(&IStack_48);
  ConvertTo16Bit(in,0,0,__return_storage_ptr__,0,0,in->_width,in->_height);
  return __return_storage_ptr__;
}

Assistant:

Image16Bit ConvertTo16Bit( const Image & in )
    {
        Image16Bit out = Image16Bit().generate( in.width(), in.height(), in.colorCount() );
        ConvertTo16Bit( in, 0, 0, out, 0, 0, in.width(), in.height() );

        return out;
    }